

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddZddSymm.c
# Opt level: O2

int cuddZddSymmCheck(DdManager *table,int x,int y)

{
  anon_union_16_2_50f58667_for_type *paVar1;
  DdHalfWord DVar2;
  DdNode *pDVar3;
  DdSubtable *pDVar4;
  DdNode *pDVar5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  DdNode *pDVar9;
  int iVar10;
  DdNode **ppDVar11;
  uint uVar12;
  DdNode *pDVar13;
  DdNode *pDVar14;
  DdNode *pDVar15;
  
  pDVar3 = table->zero;
  pDVar4 = table->subtableZ;
  DVar2 = table->invpermZ[y];
  uVar12 = pDVar4[x].slots;
  iVar8 = 0;
  bVar7 = true;
  bVar6 = true;
  do {
    uVar12 = uVar12 - 1;
    if ((int)uVar12 < 0) {
      uVar12 = pDVar4[y].slots;
      iVar10 = 0;
      while (uVar12 = uVar12 - 1, -1 < (int)uVar12) {
        ppDVar11 = pDVar4[y].nodelist + (uVar12 & 0x7fffffff);
        while (pDVar5 = *ppDVar11, pDVar5 != (DdNode *)0x0) {
          if ((pDVar5->type).kids.E != pDVar3) {
            iVar10 = iVar10 + pDVar5->ref;
          }
          ppDVar11 = &pDVar5->next;
        }
      }
      return (uint)(iVar8 == iVar10);
    }
    ppDVar11 = pDVar4[x].nodelist + (uVar12 & 0x7fffffff);
    while (pDVar5 = *ppDVar11, pDVar5 != (DdNode *)0x0) {
      pDVar13 = (pDVar5->type).kids.T;
      pDVar15 = (pDVar5->type).kids.E;
      if (pDVar13->index == DVar2) {
        pDVar14 = (pDVar13->type).kids.T;
        pDVar13 = (pDVar13->type).kids.E;
        iVar8 = iVar8 + (uint)(pDVar13 != pDVar3);
        pDVar9 = pDVar3;
        if (pDVar15->index == DVar2) goto LAB_007480eb;
      }
      else {
        pDVar14 = pDVar3;
        if (pDVar15->index != DVar2) {
          return 0;
        }
LAB_007480eb:
        paVar1 = &pDVar15->type;
        pDVar15 = (pDVar15->type).kids.E;
        iVar8 = iVar8 + (uint)(pDVar15 != pDVar3);
        pDVar9 = (paVar1->kids).T;
      }
      if (pDVar9 != pDVar13) {
        bVar7 = false;
      }
      if (pDVar14 != pDVar15) {
        bVar6 = false;
      }
      ppDVar11 = &pDVar5->next;
      if (!bVar6 && !bVar7) {
        return 0;
      }
    }
  } while( true );
}

Assistant:

int
cuddZddSymmCheck(
  DdManager * table,
  int  x,
  int  y)
{
    int         i;
    DdNode      *f, *f0, *f1, *f01, *f00, *f11, *f10;
    int         yindex;
    int         xsymmy = 1;
    int         xsymmyp = 1;
    int         arccount = 0;
    int         TotalRefCount = 0;
    int         symm_found;

    empty = table->zero;

    yindex = table->invpermZ[y];
    for (i = table->subtableZ[x].slots - 1; i >= 0; i--) {
        f = table->subtableZ[x].nodelist[i];
        while (f != NULL) {
            /* Find f1, f0, f11, f10, f01, f00 */
            f1 = cuddT(f);
            f0 = cuddE(f);
            if ((int) f1->index == yindex) {
                f11 = cuddT(f1);
                f10 = cuddE(f1);
                if (f10 != empty)
                    arccount++;
            } else {
                if ((int) f0->index != yindex) {
                    return(0); /* f bypasses layer y */
                }
                f11 = empty;
                f10 = f1;
            }
            if ((int) f0->index == yindex) {
                f01 = cuddT(f0);
                f00 = cuddE(f0);
                if (f00 != empty)
                    arccount++;
            } else {
                f01 = empty;
                f00 = f0;
            }
            if (f01 != f10)
                xsymmy = 0;
            if (f11 != f00)
                xsymmyp = 0;
            if ((xsymmy == 0) && (xsymmyp == 0))
                return(0);

            f = f->next;
        } /* for each element of the collision list */
    } /* for each slot of the subtable */

    /* Calculate the total reference counts of y
    ** whose else arc is not empty.
    */
    for (i = table->subtableZ[y].slots - 1; i >= 0; i--) {
        f = table->subtableZ[y].nodelist[i];
        while (f != NIL(DdNode)) {
            if (cuddE(f) != empty)
                TotalRefCount += f->ref;
            f = f->next;
        }
    }

    symm_found = (arccount == TotalRefCount);
#if defined(DD_DEBUG) && defined(DD_VERBOSE)
    if (symm_found) {
        int xindex = table->invpermZ[x];
        (void) fprintf(table->out,
                       "Found symmetry! x =%d\ty = %d\tPos(%d,%d)\n",
                       xindex,yindex,x,y);
    }
#endif

    return(symm_found);

}